

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assume_tests.cpp
# Opt level: O0

void __thiscall
iu_AssumeTest_x_iutest_x_NO_THROW_Test::Body(iu_AssumeTest_x_iutest_x_NO_THROW_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionHelper local_410;
  Fixed local_3e0;
  exception *e_2;
  char *e_3;
  AssertionResult iutest_ar_1;
  Fixed local_1e8;
  exception *e;
  char *e_1;
  undefined1 local_38 [8];
  AssertionResult iutest_ar;
  iu_AssumeTest_x_iutest_x_NO_THROW_Test *this_local;
  
  iutest_ar._32_8_ = this;
  iutest::detail::AlwaysZero();
  iutest::AssertionSuccess();
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (bVar1) {
    AssumeTest_NO_THROW_Test();
  }
  memset(&local_1e8,0,0x188);
  iutest::AssertionHelper::Fixed::Fixed(&local_1e8);
  pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_38);
  iutest::AssertionHelper::AssertionHelper
            ((AssertionHelper *)&iutest_ar_1.m_result,
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/assume_tests.cpp"
             ,0x67,pcVar2,kAssumeFailure);
  iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_1.m_result,&local_1e8);
  iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_1.m_result);
  iutest::AssertionHelper::Fixed::~Fixed(&local_1e8);
  e_1._0_4_ = 1;
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  if ((int)e_1 == 0) {
    iutest::detail::AlwaysZero();
    iutest::AssertionSuccess();
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)&e_3);
    if (bVar1) {
      AssumeTest_NO_THROW_Test();
    }
    memset(&local_3e0,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_3e0);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)&e_3);
    iutest::AssertionHelper::AssertionHelper
              (&local_410,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/assume_tests.cpp"
               ,0x68,pcVar2,kFatalFailure);
    iutest::AssertionHelper::operator=(&local_410,&local_3e0);
    iutest::AssertionHelper::~AssertionHelper(&local_410);
    iutest::AssertionHelper::Fixed::~Fixed(&local_3e0);
    e_1._0_4_ = 1;
    iutest::AssertionResult::~AssertionResult((AssertionResult *)&e_3);
  }
  return;
}

Assistant:

IUTEST(AssumeTest, NO_THROW)
{
    IUTEST_ASSUME_NO_THROW(AssumeTest_NO_THROW_Test());
    IUTEST_ASSERT_NO_THROW(AssumeTest_NO_THROW_Test());
}